

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

void __thiscall cmCTestCoverageHandler::cmCTestCoverageHandler(cmCTestCoverageHandler *this)

{
  _Rb_tree_header *p_Var1;
  
  cmCTestGenericHandler::cmCTestGenericHandler(&this->super_cmCTestGenericHandler);
  (this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler =
       (_func_int **)&PTR_PopulateCustomVectors_00bb91c0;
  p_Var1 = &(this->SourceLabels)._M_t._M_impl.super__Rb_tree_header;
  (this->SourceLabels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SourceLabels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->CustomCoverageExclude).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CustomCoverageExclude).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CustomCoverageExclude).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CustomCoverageExcludeRegex).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CustomCoverageExcludeRegex).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CustomCoverageExcludeRegex).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ExtraCoverageGlobs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ExtraCoverageGlobs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ExtraCoverageGlobs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SourceLabels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->SourceLabels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->SourceLabels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->TargetDirs)._M_t._M_impl.super__Rb_tree_header;
  (this->TargetDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->TargetDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->TargetDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->TargetDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->TargetDirs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LabelIdMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LabelIdMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LabelIdMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LabelIdMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LabelIdMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->LabelFilter)._M_t._M_impl.super__Rb_tree_header;
  (this->LabelFilter)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LabelFilter)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Labels).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Labels).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LabelIdMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->Labels).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LabelFilter)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LabelFilter)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->LabelFilter)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

cmCTestCoverageHandler::cmCTestCoverageHandler() = default;